

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_parse_finished(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  int iVar2;
  uchar *A;
  uchar diff;
  byte bVar3;
  ulong uVar4;
  size_t i;
  long lVar5;
  uchar buf [12];
  undefined8 local_1c;
  undefined4 local_14;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1425,"=> parse finished");
  (*ssl->handshake->calc_finished)(ssl,(uchar *)&local_1c,~*(uint *)&ssl->conf->field_0x174 & 1);
  iVar2 = mbedtls_ssl_read_record(ssl);
  if (iVar2 != 0) {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x142b,"mbedtls_ssl_read_record",iVar2);
    return iVar2;
  }
  if (ssl->in_msgtype != 0x16) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x1431,"bad finished message");
    return -0x7700;
  }
  if (*ssl->in_msg == '\x14') {
    pmVar1 = ssl->conf;
    uVar4 = (ulong)((pmVar1->field_0x174 & 2) >> 1) * 8;
    if (ssl->in_hslen == uVar4 + 0x10) {
      bVar3 = 0;
      lVar5 = 0;
      do {
        bVar3 = bVar3 | *(byte *)((long)&local_1c + lVar5) ^ ssl->in_msg[lVar5 + (uVar4 | 4)];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xc);
      if (bVar3 == 0) {
        ssl->verify_data_len = 0xc;
        *(undefined4 *)(ssl->peer_verify_data + 8) = local_14;
        *(undefined8 *)ssl->peer_verify_data = local_1c;
        if (ssl->handshake->resume == 0) {
          ssl->state = ssl->state + 1;
        }
        else if (((pmVar1->field_0x174 & 1) != 0) ||
                (ssl->state = 10, (pmVar1->field_0x174 & 1) != 0)) {
          ssl->state = 0xf;
        }
        if ((pmVar1->field_0x174 & 2) != 0) {
          mbedtls_ssl_recv_flight_completed(ssl);
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x1463,"<= parse finished");
        return 0;
      }
      iVar2 = 0x1447;
      goto LAB_00116b07;
    }
  }
  iVar2 = 0x1440;
LAB_00116b07:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,iVar2,"bad finished message");
  return -0x7e80;
}

Assistant:

int mbedtls_ssl_parse_finished( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned int hash_len;
    unsigned char buf[SSL_MAX_HASH_LEN];

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse finished" ) );

    ssl->handshake->calc_finished( ssl, buf, ssl->conf->endpoint ^ 1 );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /* There is currently no ciphersuite using another length with TLS 1.2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        hash_len = 36;
    else
#endif
        hash_len = 12;

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_FINISHED ||
        ssl->in_hslen  != mbedtls_ssl_hs_hdr_len( ssl ) + hash_len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

    if( mbedtls_ssl_safer_memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ),
                      buf, hash_len ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->verify_data_len = hash_len;
    memcpy( ssl->peer_verify_data, buf, hash_len );
#endif

    if( ssl->handshake->resume != 0 )
    {
#if defined(MBEDTLS_SSL_CLI_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
            ssl->state = MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC;
#endif
#if defined(MBEDTLS_SSL_SRV_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
#endif
    }
    else
        ssl->state++;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        mbedtls_ssl_recv_flight_completed( ssl );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse finished" ) );

    return( 0 );
}